

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdKelvinFdBeginPatchD::adjust_orig_mthd(MthdKelvinFdBeginPatchD *this)

{
  uint uVar1;
  result_type rVar2;
  MthdKelvinFdBeginPatchD *this_local;
  
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type == 0x20) {
    adjust_orig_idx(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk30 =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk30 &
         0xfffffbff;
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar2 & 1) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xff01ffff;
    }
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar2 & 1) != 0) {
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      if ((rVar2 & 7) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.debug_d =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.debug_d & 0xfffffff7 |
             8;
      }
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      if ((rVar2 & 7) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.debug_fd_check_skip = 0;
      }
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      if ((rVar2 & 7) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_misc =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_misc & 0xfeffff0f
        ;
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_misc =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_misc | 0xe0;
      }
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      if ((rVar2 & 3) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.val =
             (this->super_SingleMthdTest).super_MthdTest.val & 0xffffff | 0x10000000;
      }
    }
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar2 & 1) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_begin_patch_c =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_begin_patch_c &
           0xffff0000;
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_begin_patch_c =
           1 << ((byte)rVar2 & 0x1f) ^
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_begin_patch_c;
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_begin_patch_c =
           1 << ((byte)rVar2 & 0x1f) ^
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_begin_patch_c;
    }
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar2 & 1) != 0) {
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      if ((rVar2 & 1) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_shadow_begin_patch_c =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
             fe3d_shadow_begin_patch_c & 0xffff0000;
      }
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      if ((rVar2 & 1) != 0) {
        uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                fe3d_shadow_begin_patch_c;
        rVar2 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                              super_RepeatTest.super_Test.rnd);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_shadow_begin_patch_c =
             uVar1 & 0xfc1fffff | (uint)((rVar2 & 1) << 0x15);
      }
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      if ((rVar2 & 1) != 0) {
        uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                fe3d_shadow_begin_patch_c;
        rVar2 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                              super_RepeatTest.super_Test.rnd);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_shadow_begin_patch_c =
             uVar1 & 0x83ffffff | (uint)((rVar2 & 1) << 0x1a);
      }
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      if ((rVar2 & 1) != 0) {
        rVar2 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                              super_RepeatTest.super_Test.rnd);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_shadow_begin_patch_c =
             1 << (sbyte)(rVar2 % 0x1f) ^
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
             fe3d_shadow_begin_patch_c;
        rVar2 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                              super_RepeatTest.super_Test.rnd);
        if ((rVar2 & 1) != 0) {
          rVar2 = std::
                  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                                super_RepeatTest.super_Test.rnd);
          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_shadow_begin_patch_c
               = 1 << (sbyte)(rVar2 % 0x1f) ^
                 (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                 fe3d_shadow_begin_patch_c;
        }
      }
    }
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar2 & 1) != 0) {
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      if ((rVar2 & 7) != 0) {
        uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk1c;
        rVar2 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                              super_RepeatTest.super_Test.rnd);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk1c =
             uVar1 & 0xffffffe0 | (uint)rVar2 & 1;
      }
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      if ((rVar2 & 7) != 0) {
        uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk20;
        rVar2 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                              super_RepeatTest.super_Test.rnd);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk20 =
             uVar1 & 0x7ffffff | (uint)((rVar2 & 1) << 0x1b);
      }
    }
    adjust_orig_launch(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig,
                       &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.rnd);
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (chipset.card_type != 0x20)
			return;
		adjust_orig_idx(&orig);
		// Prevents things from blowing up...
		insrt(orig.fd_state_unk30, 10, 1, 0);
		if (rnd() & 1) {
			insrt(val, 17, 7, 0);
		}
		if (rnd() & 1) {
			if (rnd() & 7)
				insrt(orig.debug_d, 3, 1, 1);
			if (rnd() & 7)
				orig.debug_fd_check_skip = 0;
			if (rnd() & 7) {
				orig.fe3d_misc &= 0xfeffff0f;
				orig.fe3d_misc |= 0x000000e0;
			}
			if (rnd() & 3) {
				insrt(val, 24, 8, 0x10);
			}
		}
		if (rnd() & 1) {
			orig.fd_state_begin_patch_c &= 0xffff0000;
			orig.fd_state_begin_patch_c ^= 1 << (rnd() & 0x1f);
			orig.fd_state_begin_patch_c ^= 1 << (rnd() & 0x1f);
		}
		if (rnd() & 1) {
			if (rnd() & 1)
				orig.fe3d_shadow_begin_patch_c &= 0xffff0000;
			if (rnd() & 1)
				insrt(orig.fe3d_shadow_begin_patch_c, 21, 5, rnd() & 1);
			if (rnd() & 1)
				insrt(orig.fe3d_shadow_begin_patch_c, 26, 5, rnd() & 1);
			if (rnd() & 1) {
				orig.fe3d_shadow_begin_patch_c ^= 1 << (rnd() % 31);
				if (rnd() & 1)
					orig.fe3d_shadow_begin_patch_c ^= 1 << (rnd() % 31);
			}
		}
		if (rnd() & 1) {
			if (rnd() & 7)
				insrt(orig.fd_state_unk1c, 0, 5, rnd() & 1);
			if (rnd() & 7)
				insrt(orig.fd_state_unk20, 27, 5, rnd() & 1);
		}
		adjust_orig_launch(&orig, rnd);
	}